

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O2

void __thiscall iqxmlrpc::Pool_executor_factory::add_threads(Pool_executor_factory *this,uint num)

{
  Pool_thread *in_RAX;
  uint i;
  uint uVar1;
  Pool_thread threadfunc;
  Pool_thread *t;
  
  t = in_RAX;
  for (uVar1 = 0; num != uVar1; uVar1 = uVar1 + 1) {
    t = (Pool_thread *)operator_new(0x10);
    t->id = uVar1;
    t->pool = this;
    std::
    vector<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
    ::push_back(&this->pool,&t);
    threadfunc._4_4_ = 0;
    threadfunc.id = t->id;
    threadfunc.pool = t->pool;
    boost::thread_group::create_thread<iqxmlrpc::Pool_executor_factory::Pool_thread>
              (&this->threads,threadfunc);
  }
  return;
}

Assistant:

void Pool_executor_factory::add_threads( unsigned num )
{
  for( unsigned i = 0; i < num; ++i )
  {
    Pool_thread* t = new Pool_thread(i, this);
    pool.push_back(t);
    threads.create_thread(*t);
  }
}